

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O2

RGB __thiscall
RayTracer::processPixelOnSphere
          (RayTracer *this,Point *rayBeg,Point *pointOnSphere,const_iterator sphereIt,
          int recursionLevel)

{
  Point *light;
  float fVar1;
  bool bVar2;
  RGB RVar3;
  RGB reflectedColor;
  Point PVar4;
  Segment local_68;
  undefined1 local_50 [8];
  Segment refl;
  
  light = &(this->super_RayTracerBase).config.super_BaseConfig.light;
  refl.b._4_8_ = rayBeg;
  bVar2 = pointInShadow<__gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>>
                    (pointOnSphere,light,
                     (this->super_RayTracerBase).config.spheres.
                     super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<const_Sphere_*,_std::vector<Sphere,_std::allocator<Sphere>_>_>
                      )sphereIt._M_current);
  if (!bVar2) {
    bVar2 = pointInShadow<__gnu_cxx::__normal_iterator<Sphere_const*,std::vector<Sphere,std::allocator<Sphere>>>>
                      (pointOnSphere,light,sphereIt._M_current + 1,
                       (this->super_RayTracerBase).config.spheres.
                       super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if (!bVar2) {
      bVar2 = pointInShadow<__gnu_cxx::__normal_iterator<Plane_const*,std::vector<Plane,std::allocator<Plane>>>>
                        (pointOnSphere,light,
                         (this->super_RayTracerBase).config.planes.
                         super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (this->super_RayTracerBase).config.planes.
                         super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if (!bVar2) {
        PVar4 = operator-(*pointOnSphere,&(sphereIt._M_current)->center);
        fVar1 = (sphereIt._M_current)->radius;
        refl.a.x = PVar4.z / fVar1;
        local_50._4_4_ = PVar4.y / fVar1;
        local_50._0_4_ = PVar4.x / fVar1;
        RVar3 = (sphereIt._M_current)->color;
        local_68.a = operator-((this->super_RayTracerBase).config.super_BaseConfig.light,
                               pointOnSphere);
        RVar3 = calculateColorInLight(this,RVar3,(Vector *)local_50,&local_68.a);
        goto LAB_00105fea;
      }
    }
  }
  RVar3 = operator*((sphereIt._M_current)->color,
                    (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient);
LAB_00105fea:
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS((sphereIt._M_current)->reflectionCoefficient))) {
    local_68.a = *(Point *)refl.b._4_8_;
    local_68.b.x = pointOnSphere->x;
    local_68.b.y = pointOnSphere->y;
    local_68.b.z = pointOnSphere->z;
    reflection((Segment *)local_50,&local_68,sphereIt._M_current);
    reflectedColor = processPixel(this,(Segment *)local_50,recursionLevel + 1);
    RVar3 = calculateColorFromReflection
                      (RVar3,reflectedColor,(sphereIt._M_current)->reflectionCoefficient);
  }
  return RVar3;
}

Assistant:

RGB RayTracer::processPixelOnSphere(Point const& rayBeg, Point const& pointOnSphere,
                                    std::vector<Sphere>::const_iterator sphereIt,
                                    int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnSphere, config.light, config.spheres.cbegin(), sphereIt)
      || pointInShadow(pointOnSphere, config.light, sphereIt + 1, config.spheres.cend())
      || pointInShadow(pointOnSphere, config.light, config.planes.cbegin(), config.planes.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = sphereIt->color * config.ambientCoefficient;
  else
  {
    Vector const normalVec = (pointOnSphere - sphereIt->center) / sphereIt->radius;
    resultCol = calculateColorInLight(sphereIt->color, normalVec, config.light - pointOnSphere);
  }

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(sphereIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnSphere}, *sphereIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, sphereIt->reflectionCoefficient);
}